

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

StopPx * __thiscall Application::queryStopPx(StopPx *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  double value;
  PRICE PStack_18;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"StopPx: ");
  std::istream::_M_extract<double>((double *)&std::cin);
  FIX::StopPx::StopPx(__return_storage_ptr__,&PStack_18);
  return __return_storage_ptr__;
}

Assistant:

FIX::StopPx Application::queryStopPx() {
  double value;
  std::cout << std::endl << "StopPx: ";
  std::cin >> value;
  return FIX::StopPx(value);
}